

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLCOLLADACsymbol.cpp
# Opt level: O0

int __thiscall
COLLADASaxFWL::COLLADACsymbol::clone
          (COLLADACsymbol *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  int iVar1;
  undefined4 uVar3;
  COLLADACsymbol *copy;
  SidAddress *in_stack_ffffffffffffffd8;
  COLLADACsymbol *in_stack_ffffffffffffffe0;
  String *functionName;
  undefined4 in_stack_fffffffffffffff0;
  void *pvVar2;
  
  uVar3 = SUB84(__fn,0);
  functionName = (String *)0x0;
  if (this->mCSymbolType == PARAMETER) {
    pvVar2 = operator_new(0xe0);
    iVar1 = (int)pvVar2;
    COLLADACsymbol(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  }
  else {
    pvVar2 = operator_new(0xe0);
    iVar1 = (int)pvVar2;
    COLLADACsymbol((COLLADACsymbol *)CONCAT44(uVar3,in_stack_fffffffffffffff0),functionName,
                   (UniqueId *)in_stack_ffffffffffffffe0);
  }
  return iVar1;
}

Assistant:

MathML::AST::INode* COLLADACsymbol::clone(CloneFlags cloneFlags) const
	{
		COLLADACsymbol* copy = 0;
		if ( mCSymbolType == PARAMETER)
		{
			copy = new COLLADACsymbol( mSidAddress );
		}
		else
		{
			copy = new COLLADACsymbol( mFunctionName, mFormulaUniqueId );
		}
		return copy;
	}